

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O0

vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *
tinyusdz::lerp<tinyusdz::value::normal3h>
          (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *a,
          vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *b,double t)

{
  normal3h nVar1;
  unsigned_long *puVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference a_00;
  const_reference b_00;
  reference pvVar5;
  ulong local_58;
  size_t i;
  size_type local_48;
  size_type local_40;
  size_type local_38;
  size_t n;
  double local_28;
  double t_local;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *b_local;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *a_local;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *dst;
  
  n._7_1_ = 0;
  local_28 = t;
  t_local = (double)b;
  b_local = a;
  a_local = __return_storage_ptr__;
  ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::vector
            (__return_storage_ptr__);
  local_40 = ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
             size(b_local);
  local_48 = ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
             size((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                  t_local);
  puVar2 = std::min<unsigned_long>(&local_40,&local_48);
  local_38 = *puVar2;
  if (local_38 != 0) {
    ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::resize
              (__return_storage_ptr__,local_38);
    sVar3 = ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
            size(b_local);
    sVar4 = ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
            size((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                 t_local);
    if (sVar3 == sVar4) {
      for (local_58 = 0; local_58 < local_38; local_58 = local_58 + 1) {
        a_00 = ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
               ::operator[](b_local,local_58);
        b_00 = ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
               ::operator[]((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                             *)t_local,local_58);
        nVar1 = lerp<tinyusdz::value::normal3h>(a_00,b_00,local_28);
        pvVar5 = ::std::
                 vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
                 operator[](__return_storage_ptr__,local_58);
        pvVar5->x = (half)(short)nVar1._0_4_;
        pvVar5->y = (half)(short)((uint)nVar1._0_4_ >> 0x10);
        (pvVar5->z).value = nVar1.z.value.value;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}